

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O2

void anon_unknown.dwarf_fdd22::testNormalizedRounding(int n)

{
  uint extraout_EAX;
  ostream *poVar1;
  uint uVar2;
  float fVar3;
  double __x;
  float fVar4;
  half h;
  float local_3c;
  float local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"rounding normalized numbers to ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
  std::operator<<(poVar1,"-bit precision\n");
  local_38 = 0.0;
  local_3c = 0.0;
  if (n < 10) {
    local_3c = (float)(double)(((ulong)(10 - n) << 0x34) + 0x3f3ffffaa19c4774);
  }
  uVar2 = 0;
  do {
    if (uVar2 == 200000) {
      poVar1 = std::operator<<((ostream *)&std::cout,"max error          = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_38);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"max expected error = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_3c);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"ok\n\n");
      std::ostream::flush();
      return;
    }
    fVar3 = drand();
    Imath_3_2::half::half(&h,fVar3 * 65504.0);
    __x = (double)*(float *)(_imath_half_to_float_table + (ulong)h._h * 4);
    fVar3 = local_38;
    if (6.10351562e-05 <= __x) {
      if ((uVar2 & 1) != 0) {
        h._h = h._h ^ 0x8000;
      }
      Imath_3_2::half::round(&h,__x);
      fVar4 = 1.0 - *(float *)(_imath_half_to_float_table + ((ulong)extraout_EAX & 0xffff) * 4) /
                    *(float *)(_imath_half_to_float_table + (ulong)h._h * 4);
      fVar3 = -fVar4;
      if (-fVar4 <= fVar4) {
        fVar3 = fVar4;
      }
      if (local_3c < fVar3) {
        poVar1 = std::operator<<((ostream *)&std::cout,"half = ");
        poVar1 = (ostream *)operator<<(poVar1,(half)h._h);
        poVar1 = std::operator<<(poVar1,", rounded = ");
        poVar1 = (ostream *)operator<<(poVar1,(half)(uint16_t)extraout_EAX);
        poVar1 = std::operator<<(poVar1,", error = ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar3);
        poVar1 = std::operator<<(poVar1,", expected error = ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_3c);
        std::endl<char,std::char_traits<char>>(poVar1);
        printBits((ostream *)&std::cout,(half)h._h);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        printBits((ostream *)&std::cout,(half)(uint16_t)extraout_EAX);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testError.cpp"
                      ,0x89,"void (anonymous namespace)::testNormalizedRounding(int)");
      }
      if (fVar3 <= local_38) {
        fVar3 = local_38;
      }
    }
    local_38 = fVar3;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void
testNormalizedRounding (int n)
{
    cout << "rounding normalized numbers to " << n << "-bit precision\n";

    float eExpected = (n < 10) ? HALF_EPSILON * 0.5f * (1 << (10 - n)) : 0;
    float eMax      = 0;

    for (int i = 0; i < 200000; i++)
    {
        half h (drand () * HALF_MAX);

        if (h < HALF_NRM_MIN) continue;

        if (i & 1) h = -h;

        half  r (h.round (n));
        float e = 1.0f - r / h;

        if (e < 0) e = -e;

        if (e > eExpected)
        {
            cout << "half = " << h << ", rounded = " << r << ", error = " << e
                 << ", expected error = " << eExpected << endl;

            printBits (cout, h);
            cout << endl;
            printBits (cout, r);
            cout << endl;

            assert (false);
        }

        if (e > eMax) eMax = e;
    }

    cout << "max error          = " << eMax << endl;
    cout << "max expected error = " << eExpected << endl;
    cout << "ok\n\n" << flush;
}